

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O0

void __thiscall
iu_TestInformation_x_iutest_x_TestInfoCount_Test::iu_TestInformation_x_iutest_x_TestInfoCount_Test
          (iu_TestInformation_x_iutest_x_TestInfoCount_Test *this)

{
  iu_TestInformation_x_iutest_x_TestInfoCount_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_TestInformation_x_iutest_x_TestInfoCount_Test_00612098;
  return;
}

Assistant:

IUTEST(TestInformation, TestInfoCount)
{
    IUTEST_ASSERT_EQ(4, ::iuutil::GetCurrentTestSuite()->total_test_count());
    IUTEST_ASSERT_EQ(3, ::iuutil::GetCurrentTestSuite()->test_to_run_count());
    IUTEST_ASSERT_EQ(3, ::iuutil::GetCurrentTestSuite()->successful_test_count());
    IUTEST_ASSERT_EQ(0, ::iuutil::GetCurrentTestSuite()->failed_test_count());
    IUTEST_ASSERT_EQ(1, ::iuutil::GetCurrentTestSuite()->disabled_test_count());
#if !defined(IUTEST_USE_GTEST) || (defined(GTEST_MINOR) && GTEST_MINOR >= 0x07)
    IUTEST_ASSERT_EQ(1, ::iuutil::GetCurrentTestSuite()->reportable_disabled_test_count());
    IUTEST_ASSERT_EQ(4, ::iuutil::GetCurrentTestSuite()->reportable_test_count());
#endif
#if !defined(IUTEST_USE_GTEST)
    IUTEST_ASSERT_EQ(0, ::iuutil::GetCurrentTestSuite()->test_run_skipped_count());
    IUTEST_ASSERT_EQ(0, ::iuutil::GetCurrentTestSuite()->reportable_test_run_skipped_count());
    IUTEST_ASSERT_EQ(1, ::iuutil::GetCurrentTestSuite()->skip_test_count());
    IUTEST_ASSERT_EQ(1, ::iuutil::GetCurrentTestSuite()->reportable_skip_test_count());
#endif
}